

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall tlx::CmdlineParser::print_usage(CmdlineParser *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  reference ppAVar4;
  char *pcVar5;
  char local_101;
  char *local_100;
  string local_e0;
  int local_bc;
  Argument *local_b8;
  Argument *arg_2;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_a8;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_a0;
  const_iterator it_2;
  string local_88;
  int local_64;
  Argument *local_60;
  Argument *arg_1;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_50;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_48;
  const_iterator it_1;
  Argument *arg;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_30;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_28;
  const_iterator it;
  fmtflags flags;
  ostream *os_local;
  CmdlineParser *this_local;
  
  it._M_current._4_4_ = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  poVar2 = std::operator<<(os,"Usage: ");
  poVar2 = std::operator<<(poVar2,this->program_name_);
  bVar1 = std::
          vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
          empty(&this->option_list_);
  pcVar5 = "";
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar5 = " [options]";
  }
  std::operator<<(poVar2,pcVar5);
  local_30._M_current =
       (Argument **)
       std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
       ::begin(&this->param_list_);
  __gnu_cxx::
  __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
  ::__normal_iterator<tlx::CmdlineParser::Argument**>
            ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
              *)&local_28,&local_30);
  while( true ) {
    arg = (Argument *)
          std::
          vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
          end(&this->param_list_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                        *)&arg);
    if (!bVar1) break;
    ppAVar4 = __gnu_cxx::
              __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
              ::operator*(&local_28);
    it_1._M_current = (Argument **)*ppAVar4;
    if ((((Argument *)it_1._M_current)->required_ & 1U) == 0) {
      local_100 = " [";
    }
    else {
      local_100 = " <";
    }
    poVar2 = std::operator<<(os,local_100);
    poVar2 = std::operator<<(poVar2,(string *)(it_1._M_current + 2));
    pcVar5 = "";
    if ((*(byte *)((long)it_1._M_current + 0x72) & 1) != 0) {
      pcVar5 = " ...";
    }
    poVar2 = std::operator<<(poVar2,pcVar5);
    local_101 = '>';
    if (((ulong)it_1._M_current[0xe] & 1) == 0) {
      local_101 = ']';
    }
    std::operator<<(poVar2,local_101);
    __gnu_cxx::
    __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
    ::operator++(&local_28);
  }
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    output_wrap(os,&this->description_,(ulong)this->line_wrap_,0,0,0,0);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<(os,"Author: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->author_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::
          vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
          empty(&this->param_list_);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"Parameters:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_50._M_current =
         (Argument **)
         std::
         vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
         begin(&this->param_list_);
    __gnu_cxx::
    __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
    ::__normal_iterator<tlx::CmdlineParser::Argument**>
              ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
                *)&local_48,&local_50);
    while( true ) {
      arg_1 = (Argument *)
              std::
              vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ::end(&this->param_list_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          *)&arg_1);
      if (!bVar1) break;
      ppAVar4 = __gnu_cxx::
                __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                ::operator*(&local_48);
      local_60 = *ppAVar4;
      poVar2 = std::operator<<(os,"  ");
      local_64 = (int)std::setw((int)this->param_max_width_);
      poVar2 = std::operator<<(poVar2,(_Setw)local_64);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
      Argument::param_text_abi_cxx11_(&local_88,local_60);
      std::operator<<(poVar2,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      output_wrap(os,&local_60->desc_,(ulong)this->line_wrap_,0,this->param_max_width_ + 2,
                  this->param_max_width_ + 2,8);
      __gnu_cxx::
      __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
      ::operator++(&local_48);
    }
  }
  bVar1 = std::
          vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
          empty(&this->option_list_);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"Options:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_a8._M_current =
         (Argument **)
         std::
         vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
         begin(&this->option_list_);
    __gnu_cxx::
    __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
    ::__normal_iterator<tlx::CmdlineParser::Argument**>
              ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
                *)&local_a0,&local_a8);
    while( true ) {
      arg_2 = (Argument *)
              std::
              vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ::end(&this->option_list_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          *)&arg_2);
      if (!bVar1) break;
      ppAVar4 = __gnu_cxx::
                __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                ::operator*(&local_a0);
      local_b8 = *ppAVar4;
      poVar2 = std::operator<<(os,"  ");
      local_bc = (int)std::setw((int)this->option_max_width_);
      poVar2 = std::operator<<(poVar2,(_Setw)local_bc);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
      Argument::option_text_abi_cxx11_(&local_e0,local_b8);
      std::operator<<(poVar2,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      output_wrap(os,&local_b8->desc_,(ulong)this->line_wrap_,0,this->option_max_width_ + 2,
                  this->option_max_width_ + 2,8);
      __gnu_cxx::
      __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
      ::operator++(&local_a0);
    }
  }
  std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)),it._M_current._4_4_);
  return;
}

Assistant:

void CmdlineParser::print_usage(std::ostream& os) {
    std::ios::fmtflags flags(os.flags());

    os << "Usage: " << program_name_
       << (!option_list_.empty() ? " [options]" : "");

    for (ArgumentList::const_iterator it = param_list_.begin();
         it != param_list_.end(); ++it) {
        const Argument* arg = *it;

        os << (arg->required_ ? " <" : " [") << arg->longkey_
           << (arg->repeated_ ? " ..." : "") << (arg->required_ ? '>' : ']');
    }

    os << std::endl;

    if (!description_.empty()) {
        os << std::endl;
        output_wrap(os, description_, line_wrap_);
    }
    if (!author_.empty()) {
        os << "Author: " << author_ << std::endl;
    }

    if (!description_.empty() || !author_.empty())
        os << std::endl;

    if (!param_list_.empty()) {
        os << "Parameters:" << std::endl;

        for (ArgumentList::const_iterator it = param_list_.begin();
             it != param_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(param_max_width_))
               << std::left << arg->param_text();
            output_wrap(os, arg->desc_, line_wrap_, 0, param_max_width_ + 2,
                        param_max_width_ + 2, 8);
        }
    }

    if (!option_list_.empty()) {
        os << "Options:" << std::endl;

        for (ArgumentList::const_iterator it = option_list_.begin();
             it != option_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(option_max_width_))
               << std::left << arg->option_text();
            output_wrap(os, arg->desc_, line_wrap_, 0, option_max_width_ + 2,
                        option_max_width_ + 2, 8);
        }
    }

    os.flags(flags);
}